

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# saigRetFwd.c
# Opt level: O0

Aig_Man_t * Saig_ManRetimeForward(Aig_Man_t *p,int nMaxIters,int fVerbose)

{
  uint uVar1;
  uint uVar2;
  uint uVar3;
  abctime aVar4;
  abctime aVar5;
  abctime clk;
  uint local_30;
  int nRegMoves;
  int nRegFixed;
  int i;
  Aig_Man_t *pTemp;
  Aig_Man_t *pNew;
  int fVerbose_local;
  int nMaxIters_local;
  Aig_Man_t *p_local;
  
  clk._4_4_ = 1;
  pTemp = p;
  pNew._0_4_ = fVerbose;
  pNew._4_4_ = nMaxIters;
  _fVerbose_local = p;
  for (nRegMoves = 0; nRegMoves < pNew._4_4_ && 0 < (int)clk._4_4_; nRegMoves = nRegMoves + 1) {
    aVar4 = Abc_Clock();
    _nRegFixed = pTemp;
    pTemp = Saig_ManRetimeForwardOne(pTemp,(int *)&local_30,(int *)((long)&clk + 4));
    if ((int)pNew != 0) {
      uVar1 = nRegMoves + 1;
      uVar2 = Aig_ManNodeNum(_nRegFixed);
      uVar3 = Aig_ManRegNum(_nRegFixed);
      printf("%2d : And = %6d. Reg = %5d. Unret = %5d. Move = %6d. ",(ulong)uVar1,(ulong)uVar2,
             (ulong)uVar3,(ulong)local_30,(ulong)clk._4_4_);
      Abc_Print(1,"%s =","Time");
      aVar5 = Abc_Clock();
      Abc_Print(1,"%9.2f sec\n",((double)(aVar5 - aVar4) * 1.0) / 1000000.0);
    }
    if (_nRegFixed != _fVerbose_local) {
      Aig_ManStop(_nRegFixed);
    }
  }
  aVar4 = Abc_Clock();
  pTemp = Aig_ManReduceLaches(pTemp,(int)pNew);
  if ((int)pNew != 0) {
    Abc_Print(1,"%s =","Register sharing time");
    aVar5 = Abc_Clock();
    Abc_Print(1,"%9.2f sec\n",((double)(aVar5 - aVar4) * 1.0) / 1000000.0);
  }
  return pTemp;
}

Assistant:

Aig_Man_t * Saig_ManRetimeForward( Aig_Man_t * p, int nMaxIters, int fVerbose )
{
    Aig_Man_t * pNew, * pTemp;
    int i, nRegFixed, nRegMoves = 1;
    abctime clk;
    pNew = p;
    for ( i = 0; i < nMaxIters && nRegMoves > 0; i++ )
    {
        clk = Abc_Clock();
        pNew = Saig_ManRetimeForwardOne( pTemp = pNew, &nRegFixed, &nRegMoves );
        if ( fVerbose )
        {
            printf( "%2d : And = %6d. Reg = %5d. Unret = %5d. Move = %6d. ", 
                i + 1, Aig_ManNodeNum(pTemp), Aig_ManRegNum(pTemp), nRegFixed, nRegMoves );
            ABC_PRT( "Time", Abc_Clock() - clk );
        }
        if ( pTemp != p )
            Aig_ManStop( pTemp );
    }
    clk = Abc_Clock();
    pNew = Aig_ManReduceLaches( pNew, fVerbose );
    if ( fVerbose )
    {
        ABC_PRT( "Register sharing time", Abc_Clock() - clk );
    }
    return pNew;
}